

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cones.h
# Opt level: O2

bool __thiscall
mp::
Convert1<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<-1>_>,_mp::Convert1ExpC>
::operator()(Convert1<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_>,_mp::Convert1ExpC>
             *this,ConType *con,int i)

{
  FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>
  *this_00;
  bool bVar1;
  NodeRange NVar2;
  AutoLinkScope<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  auto_link_scope;
  
  this_00 = (FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>
             *)(this->
               super_Convert1ExpC<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
               ).
               super_MCKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
               .mc_;
  NVar2 = FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>
          ::SelectValueNode<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<_1>>>
                    (this_00,i);
  *(NodeRange *)(this_00 + 0xa48) = NVar2;
  auto_link_scope.cvt_ =
       (FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
        *)this_00;
  bVar1 = Convert1ExpC<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
          ::DoRun(&this->
                   super_Convert1ExpC<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                  ,&con->super_QuadAndLinTerms,-1,(con->super_AlgConRhs<_1>).rhs_);
  pre::
  AutoLinkScope<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  ::~AutoLinkScope(&auto_link_scope);
  return bVar1;
}

Assistant:

bool operator()(const ConType& con, int i) {
    static_assert (sens==1 || sens==-1, "sens 1 or -1 only");
    pre::AutoLinkScope<MCType> auto_link_scope{
      MC(), MC().template SelectValueNode<ConType>(i)
    };
    return
        CvtBase<MCType>::DoRun(con.GetBody(),
                               sens, con.rhs());
  }